

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

float nk_do_scrollbarv(nk_flags *state,nk_command_buffer *out,nk_rect scroll,int has_scrolling,
                      float offset,float target,float step,float button_pixel_inc,
                      nk_style_scrollbar *style,nk_input *in,nk_user_font *font)

{
  float fVar1;
  nk_bool nVar2;
  float fVar3;
  float fVar4;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  nk_rect bounds;
  nk_rect bounds_00;
  float local_dc;
  nk_rect local_c8;
  undefined1 local_b8 [16];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  nk_rect empty_north;
  nk_rect cursor;
  nk_rect empty_south;
  
  fStack_a4 = scroll.y;
  local_c8.x = scroll.x;
  fVar1 = local_c8.x;
  fVar4 = 0.0;
  if (style != (nk_style_scrollbar *)0x0 && out != (nk_command_buffer *)0x0) {
    auVar8._0_12_ = ZEXT812(0x3f800000);
    auVar8._12_4_ = 0;
    auVar9._8_4_ = in_XMM1_Dc;
    auVar9._0_8_ = scroll._8_8_;
    auVar9._12_4_ = in_XMM1_Dd;
    auVar9 = maxps(auVar8,auVar9);
    fVar5 = auVar9._0_4_;
    fVar7 = auVar9._4_4_;
    if (fVar7 < target) {
      local_dc = offset;
      fStack_a0 = fStack_a4;
      fStack_9c = fStack_a4;
      local_c8.y = fStack_a4;
      local_c8.w = fVar5;
      local_c8.h = fVar7;
      if (style->show_buttons != 0) {
        fVar6 = fVar7 - (fVar5 + fVar5);
        fVar4 = step;
        if (button_pixel_inc <= step) {
          fVar4 = button_pixel_inc;
        }
        bounds.h = fVar5;
        bounds.w = fVar5;
        bounds.x = (float)(int)scroll._0_8_;
        bounds.y = (float)(int)((ulong)scroll._0_8_ >> 0x20);
        local_b8 = auVar9;
        local_a8 = fStack_a4;
        nVar2 = nk_do_button_symbol((nk_flags *)&empty_north,out,bounds,style->dec_symbol,
                                    NK_BUTTON_REPEATER,&style->dec_button,in,font);
        if (nVar2 != 0) {
          local_dc = offset - fVar4;
        }
        fVar3 = 0.0;
        if (0.0 <= fVar6) {
          fVar3 = fVar6;
        }
        bounds_00.h = fVar5;
        bounds_00.w = fVar5;
        bounds_00.y = (fVar7 + local_a8) - (float)local_b8._0_4_;
        bounds_00.x = fVar1;
        nVar2 = nk_do_button_symbol((nk_flags *)&empty_north,out,bounds_00,style->inc_symbol,
                                    NK_BUTTON_REPEATER,&style->inc_button,in,font);
        if (nVar2 != 0) {
          local_dc = local_dc + fVar4;
        }
        local_c8.y = local_a8 + local_b8._0_4_;
        auVar9 = local_b8;
        local_c8.h = fVar3;
      }
      fVar1 = local_c8.h;
      if (local_c8.h <= step) {
        step = local_c8.h;
      }
      if (target - local_c8.h <= local_dc) {
        local_dc = target - local_c8.h;
      }
      fVar4 = 0.0;
      if (0.0 <= local_dc) {
        fVar4 = local_dc;
      }
      fVar5 = style->border;
      fVar7 = (style->padding).y;
      cursor.y = (fVar4 / target) * local_c8.h + local_c8.y + fVar5 + fVar7;
      fVar7 = (local_c8.h / target) * local_c8.h - (fVar7 + fVar7 + fVar5 + fVar5);
      cursor.h = 0.0;
      if (0.0 <= fVar7) {
        cursor.h = fVar7;
      }
      fVar7 = (style->padding).x;
      cursor.x = fVar5 + local_c8.x + fVar7;
      empty_north.w = auVar9._0_4_;
      cursor.w = empty_north.w - (fVar7 + fVar7 + fVar5 + fVar5);
      empty_north.x = local_c8.x;
      empty_south.y = cursor.h + cursor.y;
      empty_north.h = 0.0;
      if (0.0 <= cursor.y - local_c8.y) {
        empty_north.h = cursor.y - local_c8.y;
      }
      empty_south.x = local_c8.x;
      fVar5 = (local_c8.h + local_c8.y) - empty_south.y;
      empty_south.h = 0.0;
      if (0.0 <= fVar5) {
        empty_south.h = fVar5;
      }
      local_a8 = local_c8.y;
      empty_north.y = local_c8.y;
      empty_south.w = empty_north.w;
      fVar4 = nk_scrollbar_behavior
                        (state,in,has_scrolling,&local_c8,&cursor,&empty_north,&empty_south,fVar4,
                         target,step,NK_VERTICAL);
      local_b8._0_4_ = fVar4;
      cursor.y = (fVar4 / target) * fVar1 + local_a8 + style->border_cursor + (style->padding).y;
      if (style->draw_begin != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*style->draw_begin)(out,(nk_handle)(style->userdata).ptr);
      }
      nk_draw_scrollbar(out,*state,style,&local_c8,&cursor);
      if (style->draw_end != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*style->draw_end)(out,(nk_handle)(style->userdata).ptr);
      }
      fVar4 = (float)local_b8._0_4_;
    }
  }
  return fVar4;
}

Assistant:

NK_LIB float
nk_do_scrollbarv(nk_flags *state,
struct nk_command_buffer *out, struct nk_rect scroll, int has_scrolling,
float offset, float target, float step, float button_pixel_inc,
const struct nk_style_scrollbar *style, struct nk_input *in,
const struct nk_user_font *font)
{
struct nk_rect empty_north;
struct nk_rect empty_south;
struct nk_rect cursor;

float scroll_step;
float scroll_offset;
float scroll_off;
float scroll_ratio;

NK_ASSERT(out);
NK_ASSERT(style);
NK_ASSERT(state);
if (!out || !style) return 0;

scroll.w = NK_MAX(scroll.w, 1);
scroll.h = NK_MAX(scroll.h, 0);
if (target <= scroll.h) return 0;

/* optional scrollbar buttons */
if (style->show_buttons) {
nk_flags ws;
float scroll_h;
struct nk_rect button;

button.x = scroll.x;
button.w = scroll.w;
button.h = scroll.w;

scroll_h = NK_MAX(scroll.h - 2 * button.h,0);
scroll_step = NK_MIN(step, button_pixel_inc);

/* decrement button */
button.y = scroll.y;
if (nk_do_button_symbol(&ws, out, button, style->dec_symbol,
NK_BUTTON_REPEATER, &style->dec_button, in, font))
offset = offset - scroll_step;

/* increment button */
button.y = scroll.y + scroll.h - button.h;
if (nk_do_button_symbol(&ws, out, button, style->inc_symbol,
NK_BUTTON_REPEATER, &style->inc_button, in, font))
offset = offset + scroll_step;

scroll.y = scroll.y + button.h;
scroll.h = scroll_h;
}

/* calculate scrollbar constants */
scroll_step = NK_MIN(step, scroll.h);
scroll_offset = NK_CLAMP(0, offset, target - scroll.h);
scroll_ratio = scroll.h / target;
scroll_off = scroll_offset / target;

/* calculate scrollbar cursor bounds */
cursor.h = NK_MAX((scroll_ratio * scroll.h) - (2*style->border + 2*style->padding.y), 0);
cursor.y = scroll.y + (scroll_off * scroll.h) + style->border + style->padding.y;
cursor.w = scroll.w - (2 * style->border + 2 * style->padding.x);
cursor.x = scroll.x + style->border + style->padding.x;

/* calculate empty space around cursor */
empty_north.x = scroll.x;
empty_north.y = scroll.y;
empty_north.w = scroll.w;
empty_north.h = NK_MAX(cursor.y - scroll.y, 0);

empty_south.x = scroll.x;
empty_south.y = cursor.y + cursor.h;
empty_south.w = scroll.w;
empty_south.h = NK_MAX((scroll.y + scroll.h) - (cursor.y + cursor.h), 0);

/* update scrollbar */
scroll_offset = nk_scrollbar_behavior(state, in, has_scrolling, &scroll, &cursor,
&empty_north, &empty_south, scroll_offset, target, scroll_step, NK_VERTICAL);
scroll_off = scroll_offset / target;
cursor.y = scroll.y + (scroll_off * scroll.h) + style->border_cursor + style->padding.y;

/* draw scrollbar */
if (style->draw_begin) style->draw_begin(out, style->userdata);
nk_draw_scrollbar(out, *state, style, &scroll, &cursor);
if (style->draw_end) style->draw_end(out, style->userdata);
return scroll_offset;
}